

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void __thiscall
basist::pvrtc4_block::set_endpoint_floor(pvrtc4_block *this,uint32_t endpoint_index,color32 *c)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint endpoint_index_00;
  long in_RDX;
  uint in_ESI;
  uint32_t b_1;
  uint32_t g_1;
  uint32_t r_1;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  int a;
  uint32_t in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffcc;
  undefined1 uVar4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint32_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar4 = (undefined1)((uint)in_stack_ffffffffffffffcc >> 0x18);
  if (in_ESI < 2) {
    uVar2 = (uint)(byte)g_pvrtc_alpha_floor[*(byte *)(in_RDX + 3)];
    if (uVar2 == 8) {
      bVar1 = color32::operator[]((color32 *)
                                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                  in_stack_ffffffffffffffac);
      uVar3 = (uint)(byte)g_pvrtc_5_floor[bVar1];
      bVar1 = color32::operator[]((color32 *)
                                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                  in_stack_ffffffffffffffac);
      endpoint_index_00 = (uint)(byte)g_pvrtc_5_floor[bVar1];
      color32::operator[]((color32 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffac);
      color32::color32((color32 *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0,0x1cd638);
      set_endpoint_raw((pvrtc4_block *)CONCAT44(uVar2,uVar3),endpoint_index_00,
                       (color32 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (bool)uVar4);
    }
    else {
      bVar1 = color32::operator[]((color32 *)
                                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                  in_stack_ffffffffffffffac);
      uVar3 = (uint)(byte)g_pvrtc_4_floor[bVar1];
      color32::operator[]((color32 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffac);
      uVar4 = 0;
      color32::operator[]((color32 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffac);
      color32::color32((color32 *)CONCAT44(in_stack_ffffffffffffffb4,in_ESI),
                       in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0,0x1cd704);
      set_endpoint_raw((pvrtc4_block *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc,
                       (color32 *)CONCAT44(in_stack_ffffffffffffffd4,uVar3),(bool)uVar4);
    }
    return;
  }
  __assert_fail("endpoint_index < 2",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                ,0xc75,"void basist::pvrtc4_block::set_endpoint_floor(uint32_t, const color32 &)");
}

Assistant:

inline void set_endpoint_floor(uint32_t endpoint_index, const color32& c)
		{
			assert(endpoint_index < 2);

			int a = g_pvrtc_alpha_floor[c.a];
			if (a == 8)
			{
				// 554 or 555
				uint32_t r = g_pvrtc_5_floor[c[0]], g = g_pvrtc_5_floor[c[1]], b = c[2];

				if (!endpoint_index)
					b = g_pvrtc_4_floor[b];
				else
					b = g_pvrtc_5_floor[b];

				set_endpoint_raw(endpoint_index, color32(r, g, b, a), true);
			}
			else
			{
				// 4433 or 4443
				uint32_t r = g_pvrtc_4_floor[c[0]], g = g_pvrtc_4_floor[c[1]], b = c[2];

				if (!endpoint_index)
					b = g_pvrtc_3_floor[b];
				else
					b = g_pvrtc_4_floor[b];

				set_endpoint_raw(endpoint_index, color32(r, g, b, a), false);
			}
		}